

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O3

void __thiscall CTcDataStream::write_enum_id(CTcDataStream *this,ulong enum_id)

{
  ulong uVar1;
  CTcIdFixup *pCVar2;
  CTcIdFixup **in_RCX;
  uint32_t tmp;
  char buf [4];
  undefined4 local_1c;
  
  if (G_keep_enumfixups != 0) {
    uVar1 = this->ofs_;
    pCVar2 = (CTcIdFixup *)CTcPrsMem::alloc(G_prsmem,0x20);
    pCVar2->ds_ = this;
    pCVar2->ofs_ = uVar1;
    pCVar2->id_ = enum_id;
    in_RCX = &G_enumfixup;
    pCVar2->nxt_ = G_enumfixup;
    G_enumfixup = pCVar2;
  }
  local_1c = (undefined4)enum_id;
  write(this,(int)&local_1c,(void *)0x4,(size_t)in_RCX);
  return;
}

Assistant:

void CTcDataStream::write_enum_id(ulong enum_id)
{
    /* if there's a fixup list, add this reference */
    if (G_keep_enumfixups)
        CTcIdFixup::add_fixup(&G_enumfixup, this, get_ofs(), enum_id);

    /* write the ID */
    write4(enum_id);
}